

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::destroy_node(xml_node_struct *n,xml_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_attribute_struct *ptr;
  xml_node_struct *n_00;
  ulong uVar3;
  
  uVar3 = n->header;
  if ((uVar3 & 0x20) != 0) {
    xml_allocator::deallocate_string(alloc,n->name);
    uVar3 = n->header;
  }
  if ((uVar3 & 0x10) != 0) {
    xml_allocator::deallocate_string(alloc,n->value);
  }
  ptr = n->first_attribute;
  while (ptr != (xml_attribute_struct *)0x0) {
    uVar3 = ptr->header;
    pxVar1 = ptr->next_attribute;
    if ((uVar3 & 0x20) != 0) {
      xml_allocator::deallocate_string(alloc,ptr->name);
      uVar3 = ptr->header;
    }
    if ((uVar3 & 0x10) != 0) {
      xml_allocator::deallocate_string(alloc,ptr->value);
      uVar3 = ptr->header;
    }
    xml_allocator::deallocate_memory(alloc,ptr,0x28,(xml_memory_page *)((long)ptr - (uVar3 >> 8)));
    ptr = pxVar1;
  }
  n_00 = n->first_child;
  while (n_00 != (xml_node_struct *)0x0) {
    pxVar2 = n_00->next_sibling;
    destroy_node(n_00,alloc);
    n_00 = pxVar2;
  }
  xml_allocator::deallocate_memory(alloc,n,0x40,(xml_memory_page *)((long)n - (n->header >> 8)));
  return;
}

Assistant:

inline void destroy_node(xml_node_struct* n, xml_allocator& alloc)
	{
		if (n->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(n->name);

		if (n->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(n->value);

		for (xml_attribute_struct* attr = n->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			destroy_attribute(attr, alloc);

			attr = next;
		}

		for (xml_node_struct* child = n->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			destroy_node(child, alloc);

			child = next;
		}

		alloc.deallocate_memory(n, sizeof(xml_node_struct), PUGI__GETPAGE(n));
	}